

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O2

string * __thiscall
pageAnalyzer::getInfoFromContent
          (string *__return_storage_ptr__,pageAnalyzer *this,string *keyToFindTarStr,int offset,
          int getMode,string *keyToFindPos,char endChar)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  pointer pbVar6;
  int i;
  long lVar7;
  ulong uVar8;
  allocator local_3d;
  int local_3c;
  string *local_38;
  
  local_3c = offset;
  local_38 = keyToFindPos;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_3d);
  lVar7 = 0;
  uVar8 = 0;
  do {
    pbVar6 = (this->pageContent).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->pageContent).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
    if (uVar4 <= uVar8) {
LAB_00102e8a:
      psVar1 = local_38;
      if (uVar4 != uVar8) {
        iVar2 = local_3c + (int)uVar8;
        if (getMode == 0x12) {
          iVar3 = std::__cxx11::string::find((string *)(pbVar6 + iVar2),(ulong)local_38);
          lVar7 = (long)(iVar3 + (int)psVar1->_M_string_length);
          if (lVar7 - psVar1->_M_string_length != -1) {
            for (; (this->pageContent).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar2]._M_dataplus._M_p[lVar7] !=
                   endChar; lVar7 = lVar7 + 1) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
            }
          }
        }
        else if (getMode == 0x11) {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
      }
      return __return_storage_ptr__;
    }
    lVar5 = std::__cxx11::string::find
                      ((string *)((long)&(pbVar6->_M_dataplus)._M_p + lVar7),(ulong)keyToFindTarStr)
    ;
    if (lVar5 != -1) {
      pbVar6 = (this->pageContent).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->pageContent).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
      goto LAB_00102e8a;
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

std::string pageAnalyzer::getInfoFromContent(const std::string &keyToFindTarStr, int offset, int getMode, const std::string &keyToFindPos, char endChar)
{
    std::string result = std::string("");
    int pos = 0;
    for(; pos < this->pageContent.size(); pos++)
        if(this->pageContent[pos].find(keyToFindTarStr) != std::string::npos) break;
    if(pos == pageContent.size());
    else
    {
        pos += offset;
        if(getMode == GETMODE_ALL) result = this->pageContent[pos];
        else if(getMode == GETMODE_PART)
        {
            int startPos = this->pageContent[pos].find(keyToFindPos) + keyToFindPos.length();
            if(startPos - keyToFindPos.length() == std::string::npos);
            else
                for(int i = startPos; this->pageContent[pos][i] != endChar; i++)
                    result += this->pageContent[pos][i];
        }
    }
    return result;
}